

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mcu8str_create_empty(void)

{
  mcu8str *in_RDI;
  
  in_RDI->c_str = mcu8str_create_empty::dummy;
  in_RDI->size = 0;
  in_RDI->buflen = 0;
  in_RDI->owns_memory = 0;
  return in_RDI;
}

Assistant:

mcu8str mcu8str_create_empty(void)
  {
    static char dummy[4] = { 0, 0, 0, 0 };
    mcu8str s;
    s.c_str = &dummy[0];//NB: C4702 triggers on this line!
    s.size = 0;
    s.buflen = 0;
    s.owns_memory = 0;
    return s;
  }